

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O0

void compact_float32_suite::test_array32_float32_two(void)

{
  view_type *pvVar1;
  const_iterator pvVar2;
  const_iterator pvVar3;
  undefined4 local_78;
  value local_74 [2];
  undefined8 local_6c;
  value_type expected [8];
  undefined4 local_58;
  value local_54 [2];
  undefined4 local_4c;
  value local_48 [2];
  undefined1 local_40 [8];
  decoder decoder;
  value_type input [13];
  
  stack0xffffffffffffffeb = 0x80000000000008cd;
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[13]>
            ((decoder *)local_40,(uchar (*) [13])((long)&decoder.current.view._M_str + 3));
  local_48[0] = trial::protocol::bintoken::detail::decoder::code((decoder *)local_40);
  local_4c = 0xcd;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::array32_float32",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xdc9,"void compact_float32_suite::test_array32_float32_two()",local_48,&local_4c);
  local_54[0] = trial::protocol::bintoken::detail::decoder::symbol((decoder *)local_40);
  local_58 = 7;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::symbol::value,trial::protocol::bintoken::token::symbol::value>
            ("decoder.symbol()","token::symbol::array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xdca,"void compact_float32_suite::test_array32_float32_two()",local_54,&local_58);
  expected._4_4_ = trial::protocol::bintoken::detail::decoder::category((decoder *)local_40);
  expected[0] = '\x02';
  expected[1] = '\0';
  expected[2] = '\0';
  expected[3] = '\0';
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::category::value,trial::protocol::bintoken::token::category::value>
            ("decoder.category()","token::category::data",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xdcb,"void compact_float32_suite::test_array32_float32_two()",expected + 4,expected);
  local_6c = 0x3f8000003f800000;
  pvVar1 = trial::protocol::bintoken::detail::decoder::literal((decoder *)local_40);
  pvVar2 = std::
           basic_string_view<unsigned_char,_trial::protocol::core::detail::char_traits<unsigned_char>_>
           ::begin(pvVar1);
  pvVar1 = trial::protocol::bintoken::detail::decoder::literal((decoder *)local_40);
  pvVar3 = std::
           basic_string_view<unsigned_char,_trial::protocol::core::detail::char_traits<unsigned_char>_>
           ::end(pvVar1);
  boost::detail::
  test_all_with_impl<std::ostream,unsigned_char_const*,unsigned_char_const*,std::equal_to<unsigned_char>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xdd1,"void compact_float32_suite::test_array32_float32_two()",pvVar2,pvVar3,&local_6c
             ,expected);
  trial::protocol::bintoken::detail::decoder::next((decoder *)local_40);
  local_74[0] = trial::protocol::bintoken::detail::decoder::code((decoder *)local_40);
  local_78 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xdd3,"void compact_float32_suite::test_array32_float32_two()",local_74,&local_78);
  return;
}

Assistant:

void test_array32_float32_two()
{
    const value_type input[] = { token::code::array32_float32, 0x08, 0x00, 0x00, 0x00, 0x00, 0x00, 0x80, 0x3F, 0x00, 0x00, 0x80, 0x3F };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::array32_float32);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.symbol(), token::symbol::array);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.category(), token::category::data);
    const value_type expected[] = {
        0x00, 0x00, 0x80, 0x3F, 0x00, 0x00, 0x80, 0x3F
    };
    TRIAL_PROTOCOL_TEST_ALL_WITH(decoder.literal().begin(), decoder.literal().end(),
                                 expected, expected + sizeof(expected),
                                 std::equal_to<value_type>());
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}